

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int32_t nghttp2_session_get_stream_remote_window_size(nghttp2_session *session,int32_t stream_id)

{
  nghttp2_stream *pnVar1;
  int32_t local_2c;
  nghttp2_stream *stream;
  int32_t stream_id_local;
  nghttp2_session *session_local;
  
  pnVar1 = nghttp2_session_get_stream(session,stream_id);
  if (pnVar1 == (nghttp2_stream *)0x0) {
    session_local._4_4_ = -1;
  }
  else {
    if (pnVar1->remote_window_size < 0) {
      local_2c = 0;
    }
    else {
      local_2c = pnVar1->remote_window_size;
    }
    session_local._4_4_ = local_2c;
  }
  return session_local._4_4_;
}

Assistant:

int32_t nghttp2_session_get_stream_remote_window_size(nghttp2_session *session,
                                                      int32_t stream_id) {
  nghttp2_stream *stream;

  stream = nghttp2_session_get_stream(session, stream_id);
  if (stream == NULL) {
    return -1;
  }

  /* stream->remote_window_size can be negative when
     SETTINGS_INITIAL_WINDOW_SIZE is changed. */
  return nghttp2_max(0, stream->remote_window_size);
}